

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void xPredIntraAngAdiChroma_XY(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int i2;
  int iYy;
  pel *px;
  int iStack_288;
  int srcOff;
  int xsteps [64];
  int xoffsets [64];
  pel *rpSrc;
  int offsety;
  int offsetx;
  int j;
  int i;
  int iHeight_local;
  int iWidth_local;
  int uiDirMode_local;
  int i_dst_local;
  pel *dst_local;
  pel *pSrc_local;
  int local_48;
  int iTempDn_1;
  int ishift_1;
  int imult_1;
  int local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int local_28;
  int iTempDn;
  int ishift;
  int imult;
  int local_14;
  undefined4 local_10;
  int local_c;
  
  dst_local = pSrc;
  _uiDirMode_local = dst;
  iWidth_local = i_dst;
  iHeight_local = uiDirMode;
  i = iWidth;
  j = iHeight;
  for (offsetx = 0; offsetx < i; offsetx = offsetx + 1) {
    local_14 = offsetx + 1;
    local_c = iHeight_local;
    local_10 = 1;
    _ishift = xsteps + (long)offsetx + 0x3e;
    iTempDn = (int)tab_auc_dir_dxdy[1][iHeight_local][0];
    bVar1 = tab_auc_dir_dxdy[1][iHeight_local][1];
    local_28 = (int)(char)bVar1;
    local_2c = local_14 * iTempDn >> (bVar1 & 0x1f);
    xsteps[(long)offsetx + 0x3e] = (local_14 * iTempDn * 0x20 >> (bVar1 & 0x1f)) + local_2c * -0x20;
    (&iStack_288)[offsetx] = local_2c;
  }
  for (offsety = 0; offsety < j; offsety = offsety + 1) {
    local_38 = offsety + 1;
    local_30 = iHeight_local;
    local_34 = 0;
    _ishift_1 = (long)&rpSrc + 4;
    iTempDn_1 = (int)tab_auc_dir_dxdy[0][iHeight_local][0];
    bVar1 = tab_auc_dir_dxdy[0][iHeight_local][1];
    local_48 = (int)(char)bVar1;
    pSrc_local._4_4_ = local_38 * iTempDn_1 >> (bVar1 & 0x1f);
    iVar4 = (local_38 * iTempDn_1 * 0x20 >> (bVar1 & 0x1f)) + pSrc_local._4_4_ * -0x20;
    _i2 = dst_local + -(long)(pSrc_local._4_4_ << 1);
    for (offsetx = 0; offsetx < i; offsetx = offsetx + 1) {
      uVar2 = offsety - (&iStack_288)[offsetx];
      iVar3 = offsetx * 2;
      if (uVar2 < 0x80000000) {
        rpSrc._0_4_ = xsteps[(long)offsetx + 0x3e];
        _uiDirMode_local[iVar3] =
             (pel)((int)((uint)pSrc[(int)(uVar2 * -2 + -4)] * (0x20 - (int)rpSrc) +
                         (uint)pSrc[(int)(uVar2 * -2 + -2)] * (0x40 - (int)rpSrc) +
                         (uint)pSrc[(int)(uVar2 * -2)] * ((int)rpSrc + 0x20) +
                         (uint)pSrc[(int)(uVar2 * -2 + 2)] * (int)rpSrc + 0x40) >> 7);
        _uiDirMode_local[iVar3 + 1] =
             (pel)((int)((uint)pSrc[(int)(uVar2 * -2 + -3)] * (0x20 - (int)rpSrc) +
                         (uint)pSrc[(int)(uVar2 * -2 + -1)] * (0x40 - (int)rpSrc) +
                         (uint)pSrc[(int)(uVar2 * -2 + 1)] * ((int)rpSrc + 0x20) +
                         (uint)pSrc[(int)(uVar2 * -2 + 3)] * (int)rpSrc + 0x40) >> 7);
      }
      else {
        _uiDirMode_local[iVar3] =
             (pel)((int)((uint)_i2[4] * (0x20 - iVar4) + (uint)_i2[2] * (0x40 - iVar4) +
                         (uint)*_i2 * (iVar4 + 0x20) + (uint)_i2[-2] * iVar4 + 0x40) >> 7);
        _uiDirMode_local[iVar3 + 1] =
             (pel)((int)((uint)_i2[5] * (0x20 - iVar4) + (uint)_i2[3] * (0x40 - iVar4) +
                         (uint)_i2[1] * (iVar4 + 0x20) + (uint)_i2[-1] * iVar4 + 0x40) >> 7);
      }
      _i2 = _i2 + 2;
    }
    _uiDirMode_local = _uiDirMode_local + iWidth_local;
  }
  return;
}

Assistant:

static void xPredIntraAngAdiChroma_XY(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i, j;
    int offsetx, offsety;
    pel *rpSrc = pSrc;
    int xoffsets[64];
    int xsteps[64];

    for (i = 0; i < iWidth; i++) {
        xsteps[i] = getContextPixel(uiDirMode, 1, i + 1, &xoffsets[i]);
    }

    for (j = 0; j < iHeight; j++) {
        int srcOff = getContextPixel(uiDirMode, 0, j + 1, &offsetx) << 1;
        pel *px = pSrc - srcOff;

        for (i = 0; i < iWidth; i++, px += 2) {
            int iYy = j - xsteps[i];
            int i2 = i << 1;
            if (iYy <= -1) {
                dst[i2] = (px[4] * (32 - offsetx) + px[2] * (64 - offsetx) + px[0] * (32 + offsetx) + px[-2] * offsetx + 64) >> 7; //U
                dst[i2 + 1] = (px[5] * (32 - offsetx) + px[3] * (64 - offsetx) + px[1] * (32 + offsetx) + px[-1] * offsetx + 64) >> 7; //V
            }
            else {
                offsety = xoffsets[i];
                iYy *= 2;
                dst[i2] = (rpSrc[-iYy - 4] * (32 - offsety) + rpSrc[-iYy - 2] * (64 - offsety) + rpSrc[-iYy] * (32 + offsety) + rpSrc[-iYy + 2] * offsety + 64) >> 7; //U
                dst[i2 + 1] = (rpSrc[-iYy - 3] * (32 - offsety) + rpSrc[-iYy - 1] * (64 - offsety) + rpSrc[-iYy + 1] * (32 + offsety) + rpSrc[-iYy + 3] * offsety + 64) >> 7; //U
            }
        }
        dst += i_dst;
    }
}